

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
PlanningUnitMADPDiscrete::JointToIndividualObservationHistoryIndices
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          PlanningUnitMADPDiscrete *this,Index johI)

{
  _func_int *p_Var1;
  long lVar2;
  Index IVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference pvVar5;
  reference __x;
  undefined4 extraout_var_01;
  pointer puVar6;
  uint uVar7;
  ulong uVar8;
  Index agentI;
  undefined8 uStack_90;
  undefined1 auStack_88 [8];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  indivO_vec;
  undefined1 auStack_58 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> indivIndicesThisT;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *ohI_vec;
  
  uStack_90 = 0x464eec;
  IVar3 = GetTimeStepForJOHI(this,johI);
  indivIndicesThisT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)IVar3;
  lVar2 = -((long)indivIndicesThisT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage * 4 + 0xfU & 0xfffffffffffffff0)
  ;
  *(undefined8 *)((long)&uStack_90 + lVar2) = 0x464f17;
  GetJointObservationHistoryArrays(this,johI,IVar3,(Index *)(auStack_88 + lVar2));
  uVar8 = 0;
  indivO_vec.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_88 = (undefined1  [8])0x0;
  indivO_vec.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  while( true ) {
    p_Var1 = (this->super_PlanningUnit)._vptr_PlanningUnit[6];
    *(undefined8 *)((long)&uStack_90 + lVar2) = 0x464f38;
    iVar4 = (*p_Var1)(this);
    if (CONCAT44(extraout_var,iVar4) <= uVar8) break;
    indivIndicesThisT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_58 = (undefined1  [8])0x0;
    indivIndicesThisT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    *(undefined8 *)((long)&uStack_90 + lVar2) = 0x464f59;
    std::
    vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
    ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
              ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                *)auStack_88,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_58);
    *(undefined8 *)((long)&uStack_90 + lVar2) = 0x464f61;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_58);
    uVar8 = (ulong)((int)uVar8 + 1);
  }
  for (puVar6 = (pointer)0x0;
      puVar6 != indivIndicesThisT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
      puVar6 = (pointer)((long)puVar6 + 1)) {
    IVar3 = *(Index *)((long)(auStack_88 + lVar2) + puVar6 * 4);
    *(undefined8 *)((long)&uStack_90 + lVar2) = 0x464f8c;
    JointToIndividualObservationIndices
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_58,this,IVar3);
    uVar7 = 0;
    while( true ) {
      p_Var1 = (this->super_PlanningUnit)._vptr_PlanningUnit[6];
      *(undefined8 *)((long)&uStack_90 + lVar2) = 0x464f98;
      iVar4 = (*p_Var1)(this);
      uVar8 = (ulong)uVar7;
      if (CONCAT44(extraout_var_00,iVar4) <= uVar8) break;
      *(undefined8 *)((long)&uStack_90 + lVar2) = 0x464fab;
      pvVar5 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::at((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     *)auStack_88,uVar8);
      *(undefined8 *)((long)&uStack_90 + lVar2) = 0x464fb9;
      __x = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_58,uVar8);
      *(undefined8 *)((long)&uStack_90 + lVar2) = 0x464fc4;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pvVar5,__x);
      uVar7 = uVar7 + 1;
    }
    *(undefined8 *)((long)&uStack_90 + lVar2) = 0x464fd1;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_58);
  }
  uVar7 = 0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  while( true ) {
    p_Var1 = (this->super_PlanningUnit)._vptr_PlanningUnit[6];
    *(undefined8 *)((long)&uStack_90 + lVar2) = 0x464ffe;
    iVar4 = (*p_Var1)(this);
    if (CONCAT44(extraout_var_01,iVar4) <= (ulong)uVar7) break;
    *(undefined8 *)((long)&uStack_90 + lVar2) = 0x465010;
    pvVar5 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::at((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)auStack_88,(ulong)uVar7);
    puVar6 = indivIndicesThisT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    *(undefined8 *)((long)&uStack_90 + lVar2) = 0x465021;
    IVar3 = GetObservationHistoryIndex(this,uVar7,(Index)puVar6,pvVar5);
    auStack_58._0_4_ = IVar3;
    *(undefined8 *)((long)&uStack_90 + lVar2) = 0x465030;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (__return_storage_ptr__,(value_type_conflict1 *)auStack_58);
    uVar7 = uVar7 + 1;
  }
  *(undefined8 *)((long)&uStack_90 + lVar2) = 0x46503d;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)auStack_88);
  return __return_storage_ptr__;
}

Assistant:

vector<Index>
PlanningUnitMADPDiscrete::JointToIndividualObservationHistoryIndices(Index
        johI) const
{
    Index t = GetTimeStepForJOHI(johI);
    Index jo_array[t];
    GetJointObservationHistoryArrays(johI, t, jo_array );

    //convert joint observations -> indiv. observations
    vector< vector<Index> > indivO_vec;
    
    for (Index agentI=0; agentI<GetNrAgents(); agentI++)
        indivO_vec.push_back( vector<Index>() );

    for (Index ts=0; ts<t; ts++)
    {
        vector<Index> indivIndicesThisT = 
            JointToIndividualObservationIndices(jo_array[ts]);
        for (Index agentI=0; agentI<GetNrAgents(); agentI++)
            indivO_vec.at(agentI).push_back( indivIndicesThisT.at(agentI) );
    }
            
    //calculate indiv observation history index from seq. of indiv. observations
    vector<Index> ohI_vec;
    for (Index agentI=0; agentI<GetNrAgents(); agentI++)
    {
        Index this_agentOHI = GetObservationHistoryIndex(agentI, t, 
                                                     indivO_vec.at(agentI) );
        ohI_vec.push_back(this_agentOHI);
    }
    return(ohI_vec);
}